

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolledbitpacking.h
# Opt level: O3

void FastPForLib::__pack<9u,true>(uint32_t *in,uint32_t *out)

{
  uint32_t k;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  iVar1 = 0;
  uVar3 = 0;
  do {
    if (uVar3 == 0) {
      uVar3 = *in;
      in = in + 1;
      *out = uVar3 & 0x1ff;
      uVar3 = 9;
LAB_00107e6b:
      uVar4 = *out;
      uVar2 = uVar3;
      do {
        uVar3 = *in;
        in = in + 1;
        uVar4 = uVar4 | (uVar3 & 0x1ff) << (uVar2 & 0x1f);
        uVar3 = uVar2 + 9;
        *out = uVar4;
        bVar5 = uVar2 < 0xf;
        uVar2 = uVar3;
      } while (bVar5);
    }
    else if (uVar3 < 0x18) goto LAB_00107e6b;
    uVar4 = 0;
    if (uVar3 < 0x20) {
      uVar4 = *in;
      uVar2 = *in;
      in = in + 1;
      *out = *out | (uVar4 & 0x1ff) << (uVar3 & 0x1f);
      out[1] = (uVar2 & 0x1ff) >> ((byte)-(char)uVar3 & 0x1f);
      uVar4 = uVar3 - 0x17;
    }
    uVar3 = uVar4;
    iVar1 = iVar1 + 1;
    out = out + 1;
    if (iVar1 == 9) {
      return;
    }
  } while( true );
}

Assistant:

void __pack(const uint32_t *__restrict__ in, uint32_t *__restrict__ out) {
  uint32_t inwordpointer = 0; // indicates where we are reading
  // k iterates over the output
  for (uint32_t k = 0; k < bit; ++k, ++out) {
    if (inwordpointer == 0) {
      *out = __bitmask<bit, mask>(*in++);
      inwordpointer += bit;
    }
    // compiler (gcc 4.6.3) had trouble with this, cannot unroll
    // while(inwordpointer <= 32-bit) {
    //    *out |= __bitmask<bit, mask> (*in++) << inwordpointer;
    //    inwordpointer += bit;
    //}
    // attempt (grungy!)

    // loop cannot iterate much
    for (uint32_t i = 0; i < 1 + 32 / bit; ++i) {
      if (inwordpointer > 32 - bit)
        break;
      *out |= __bitmask<bit, mask>(*in++) << inwordpointer;
      inwordpointer += bit;
    }
    // end ofk grunge

    if (inwordpointer < 32) {
      *out |= __bitmask<bit, mask>(*in) << inwordpointer;
      inwordpointer += bit - 32;
      *(out + 1) = __bitmask<bit, mask>(*in++) >> (bit - inwordpointer);

    } else
      // inwordpointer==32
      inwordpointer = 0;
  }
}